

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::extractInstructionsFromCalls
          (InvocationInterlockPlacementPass *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *blocks)

{
  BasicBlock *this_00;
  bool bVar1;
  reference ppBVar2;
  anon_class_16_2_0e352904 local_70;
  function<void_(spvtools::opt::Instruction_*)> local_60;
  BasicBlock *local_40;
  BasicBlock *block;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *pvStack_18;
  bool modified;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *blocks_local;
  InvocationInterlockPlacementPass *this_local;
  
  __range2._7_1_ = 0;
  pvStack_18 = blocks;
  blocks_local = (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  *)this;
  __end2 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
           begin(blocks);
  block = (BasicBlock *)
          std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
          end(blocks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                *)&block);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppBVar2;
    local_70.modified = (bool *)((long)&__range2 + 7);
    local_70.this = this;
    local_40 = this_00;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::InvocationInterlockPlacementPass::extractInstructionsFromCalls(std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_60,&local_70);
    BasicBlock::ForEachInst(this_00,&local_60,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_60);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
    ::operator++(&__end2);
  }
  return (bool)(__range2._7_1_ & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::extractInstructionsFromCalls(
    std::vector<BasicBlock*> blocks) {
  bool modified = false;

  for (BasicBlock* block : blocks) {
    block->ForEachInst([this, &modified](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        uint32_t function_id =
            inst->GetSingleWordInOperand(kFunctionCallFunctionIdInIdx);
        Function* func = context()->GetFunction(function_id);
        ExtractionResult result = extracted_functions_[func];

        if (result.had_begin) {
          Instruction* new_inst = new Instruction(
              context(), spv::Op::OpBeginInvocationInterlockEXT);
          new_inst->InsertBefore(inst);
          modified = true;
        }
        if (result.had_end) {
          Instruction* new_inst =
              new Instruction(context(), spv::Op::OpEndInvocationInterlockEXT);
          new_inst->InsertAfter(inst);
          modified = true;
        }
      }
    });
  }
  return modified;
}